

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O3

void __thiscall
VPLGrammar::Parser::AssignmentExpressionNode::BuildProgram
          (AssignmentExpressionNode *this,Scope *scope,ostream *out)

{
  pointer puVar1;
  __uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_> _Var2;
  undefined8 in_RAX;
  long lVar3;
  ostream *poVar4;
  undefined8 uStack_28;
  
  puVar1 = (this->super_ASTNodeBasic).children_.
           super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->super_ASTNodeBasic).children_.
            super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 == 8) {
    _Var2._M_t.
    super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
    .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl =
         (puVar1->_M_t).
         super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
         ._M_t;
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                          .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl +
                0x28))(_Var2._M_t.
                       super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                       .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl,scope,
                       out);
    return;
  }
  _Var2._M_t.
  super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
  .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl =
       puVar1[1]._M_t.
       super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
       ._M_t;
  uStack_28 = in_RAX;
  (**(code **)(*(long *)_Var2._M_t.
                        super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                        .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl +
              0x28))(_Var2._M_t.
                     super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                     .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl,scope,
                     out);
  lVar3 = __dynamic_cast((_Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                          )(((this->super_ASTNodeBasic).children_.
                             super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                           super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                           ._M_t,&ASTNodeBasic::typeinfo,&ASTTokenBasic::typeinfo,0);
  vpl::Scope::LoadVariableAddr(scope,(string *)(lVar3 + 0x38));
  std::__ostream_insert<char,std::char_traits<char>>(out,"    pop %",9);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)out,2);
  uStack_28._0_7_ = CONCAT16(10,(undefined6)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_28 + 6),1);
  scope->cur_stack_pos_ = scope->cur_stack_pos_ + -1;
  std::__ostream_insert<char,std::char_traits<char>>(out,"    dup\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(out,"    pop !",9);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)out,2);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_28 + 7),1);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                if (children_.size() == 1) {
                    children_[0]->BuildProgram(scope, out);
                    return;
                }
                children_[1]->BuildProgram(scope, out);
                scope->LoadVariableAddr(GET_TOKEN_STRING(children_[0]));
                out << "    pop %" << scope->AssignRegister() << '\n';
                scope->Pop();
                out << "    dup\n";
                out << "    pop !" << scope->AssignRegister() << '\n';
            }